

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateTargetFileSets
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ostream *os,cmTargetExport *te)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *this_01;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  WrapQuotes wrapQuotes;
  cmTargetExport *in_R8;
  string_view str;
  string_view str_00;
  undefined1 auVar4 [16];
  string local_240 [32];
  string local_220 [32];
  undefined1 local_200 [16];
  string local_1f0;
  undefined1 local_1d0 [16];
  string local_1c0;
  int local_19c;
  cmAlphaNum local_198;
  cmAlphaNum local_168;
  string local_138;
  cmFileSet *local_118;
  cmFileSet *fileSet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmAlphaNum local_d0;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string targetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfaceFileSets;
  cmTargetExport *te_local;
  ostream *os_local;
  cmGeneratorTarget *gte_local;
  cmExportFileGenerator *this_local;
  
  cmTarget::GetAllInterfaceFileSets_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&targetName.field_2 + 8),gte->Target);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&targetName.field_2 + 8));
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_90,&this->Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&__range2,gte);
    cmAlphaNum::cmAlphaNum(&local_d0,(string *)&__range2);
    cmStrCat<>((string *)local_60,&local_90,&local_d0);
    std::__cxx11::string::~string((string *)&__range2);
    poVar2 = std::operator<<(os,"if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n  target_sources(");
    poVar2 = std::operator<<(poVar2,(string *)local_60);
    std::operator<<(poVar2,"\n");
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&targetName.field_2 + 8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
    while( true ) {
      wrapQuotes = (WrapQuotes)in_R8;
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&name);
      if (!bVar1) break;
      fileSet = (cmFileSet *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      local_118 = cmTarget::GetFileSet(gte->Target,(string *)fileSet);
      if (local_118 == (cmFileSet *)0x0) {
        this_01 = gte->Makefile;
        cmAlphaNum::cmAlphaNum(&local_168,"File set \"");
        cmAlphaNum::cmAlphaNum(&local_198,&fileSet->Name);
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
        cmStrCat<char[39],std::__cxx11::string,char[26]>
                  (&local_138,&local_168,&local_198,
                   (char (*) [39])"\" is listed in interface file sets of ",psVar3,
                   (char (*) [26])" but has not been created");
        cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        local_19c = 1;
        goto LAB_006a9016;
      }
      poVar2 = std::operator<<(os,"    INTERFACE");
      poVar2 = std::operator<<(poVar2,"\n      FILE_SET ");
      auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)fileSet);
      str._M_len = auVar4._8_8_;
      str._M_str = (char *)0x0;
      local_1d0 = auVar4;
      cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_1c0,auVar4._0_8_,str,wrapQuotes);
      poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
      poVar2 = std::operator<<(poVar2,"\n      TYPE ");
      psVar3 = cmFileSet::GetType_abi_cxx11_(local_118);
      auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      str_00._M_len = auVar4._8_8_;
      str_00._M_str = (char *)0x0;
      local_200 = auVar4;
      cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_1f0,auVar4._0_8_,str_00,wrapQuotes);
      poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
      poVar2 = std::operator<<(poVar2,"\n      BASE_DIRS ");
      (*this->_vptr_cmExportFileGenerator[0x11])(local_220,this,gte,local_118,te);
      poVar2 = std::operator<<(poVar2,local_220);
      poVar2 = std::operator<<(poVar2,"\n      FILES ");
      in_R8 = te;
      (*this->_vptr_cmExportFileGenerator[0x12])(local_240,this,gte);
      poVar2 = std::operator<<(poVar2,local_240);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1c0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::operator<<(os,"  )\nendif()\n\n");
    local_19c = 0;
LAB_006a9016:
    std::__cxx11::string::~string((string *)local_60);
    if (local_19c != 0) goto LAB_006a9042;
  }
  local_19c = 0;
LAB_006a9042:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&targetName.field_2 + 8));
  return;
}

Assistant:

void cmExportFileGenerator::GenerateTargetFileSets(cmGeneratorTarget* gte,
                                                   std::ostream& os,
                                                   cmTargetExport* te)
{
  auto interfaceFileSets = gte->Target->GetAllInterfaceFileSets();
  if (!interfaceFileSets.empty()) {
    std::string targetName = cmStrCat(this->Namespace, gte->GetExportName());
    os << "if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n"
          "  target_sources("
       << targetName << "\n";

    for (auto const& name : interfaceFileSets) {
      auto* fileSet = gte->Target->GetFileSet(name);
      if (!fileSet) {
        gte->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("File set \"", name,
                   "\" is listed in interface file sets of ", gte->GetName(),
                   " but has not been created"));
        return;
      }

      os << "    INTERFACE"
         << "\n      FILE_SET " << cmOutputConverter::EscapeForCMake(name)
         << "\n      TYPE "
         << cmOutputConverter::EscapeForCMake(fileSet->GetType())
         << "\n      BASE_DIRS "
         << this->GetFileSetDirectories(gte, fileSet, te) << "\n      FILES "
         << this->GetFileSetFiles(gte, fileSet, te) << "\n";
    }

    os << "  )\nendif()\n\n";
  }
}